

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_flac__read_next_flac_frame_header
                    (ma_dr_flac_bs *bs,ma_uint8 streaminfoBitsPerSample,
                    ma_dr_flac_frame_header *header)

{
  byte bVar1;
  undefined4 uVar2;
  ulong uVar3;
  ulong uVar4;
  ma_dr_flac_frame_header *pmVar5;
  ma_uint16 *pmVar6;
  ma_uint8 *pmVar7;
  ma_uint8 mVar8;
  ma_uint16 mVar9;
  ma_bool32 mVar10;
  ma_result mVar11;
  int iVar12;
  uint uVar13;
  ma_uint32 mVar14;
  ulong uVar15;
  ushort uVar16;
  uint uVar17;
  undefined7 in_register_00000031;
  ma_dr_flac_cache_t mVar18;
  byte bVar19;
  ma_dr_flac_frame_header *pmVar20;
  byte local_80;
  ma_uint8 reserved;
  ma_uint8 local_7e;
  ma_uint8 bitsPerSample;
  ma_uint8 channelAssignment;
  ma_uint8 sampleRate;
  ma_uint8 blockSize;
  ma_uint8 blockingStrategy;
  uint local_78;
  ma_uint8 local_71;
  ulong local_70;
  ulong local_68;
  ma_dr_flac_frame_header *local_60;
  ma_uint8 hi;
  ma_uint16 *local_50;
  uint local_44;
  ulong local_40;
  ma_uint8 *local_38;
  
  uVar15 = CONCAT71(in_register_00000031,streaminfoBitsPerSample) & 0xffffffff;
  local_50 = &header->blockSizeInPCMFrames;
  local_38 = &header->crc8;
  do {
    reserved = '\0';
    blockingStrategy = '\0';
    blockSize = '\0';
    sampleRate = '\0';
    channelAssignment = '\0';
    bitsPerSample = '\0';
    do {
      mVar10 = ma_dr_flac__seek_bits(bs,(ulong)(-bs->consumedBits & 7));
      if (mVar10 == 0) {
        return 0;
      }
      do {
        bs->crc16 = 0;
        bs->crc16CacheIgnoredBytes = bs->consumedBits >> 3;
        mVar10 = ma_dr_flac__read_uint8(bs,8,&hi);
        if (mVar10 == 0) {
          return 0;
        }
      } while (hi != 0xff);
      mVar10 = ma_dr_flac__read_uint8(bs,6,&local_71);
      if (mVar10 == 0) {
        return 0;
      }
    } while (local_71 != '>');
    mVar10 = ma_dr_flac__read_uint8(bs,1,&reserved);
    if (mVar10 == 0) {
      return 0;
    }
    local_78 = (uint)uVar15;
    local_60 = header;
    if (reserved != '\x01') {
      bVar19 = ""[~(uint)reserved & 1];
      mVar10 = ma_dr_flac__read_uint8(bs,1,&blockingStrategy);
      if (mVar10 == 0) {
        return 0;
      }
      local_70 = CONCAT71(local_70._1_7_,blockingStrategy);
      bVar19 = (bVar19 ^ 0x9c) * '\x02' ^ ""[(byte)(blockingStrategy & 1 ^ (bVar19 ^ 0x9c) >> 7)];
      mVar10 = ma_dr_flac__read_uint8(bs,4,&blockSize);
      if (mVar10 == 0) {
        return 0;
      }
      if (blockSize != '\0') {
        local_44 = (uint)blockSize;
        bVar1 = ""[(byte)(blockSize & 0xf ^ bVar19 >> 4)];
        mVar10 = ma_dr_flac__read_uint8(bs,4,&sampleRate);
        if (mVar10 == 0) {
          return 0;
        }
        local_40 = (ulong)sampleRate;
        bVar19 = ""[(byte)(sampleRate & 0xf ^ (byte)(bVar19 << 4 ^ bVar1) >> 4)];
        mVar10 = ma_dr_flac__read_uint8(bs,4,&channelAssignment);
        if (mVar10 == 0) {
          return 0;
        }
        local_7e = channelAssignment;
        if (channelAssignment < 0xb) {
          bVar19 = bVar19 << 4 ^ ""[(byte)((byte)(bVar1 << 4 ^ bVar19) >> 4 ^ channelAssignment)];
          mVar10 = ma_dr_flac__read_uint8(bs,3,&bitsPerSample);
          if (mVar10 == 0) {
            return 0;
          }
          if ((bitsPerSample & 0xfb) != 3) {
            bVar19 = bVar19 * '\b' ^ ""[(byte)(bitsPerSample & 7 ^ bVar19 >> 5)];
            local_68 = (ulong)bitsPerSample;
            mVar10 = ma_dr_flac__read_uint8(bs,1,&reserved);
            if (mVar10 == 0) {
              return 0;
            }
            if (reserved != '\x01') {
              local_80 = bVar19 * '\x02' ^ ""[(byte)(reserved & 1 ^ bVar19 >> 7)];
              if ((char)local_70 == '\x01') {
                mVar11 = ma_dr_flac__read_utf8_coded_number(bs,(ma_uint64 *)&hi,&local_80);
                if (mVar11 != MA_SUCCESS) {
LAB_0017c9fd:
                  if (mVar11 == MA_AT_END) {
                    return 0;
                  }
                  goto LAB_0017cb5c;
                }
                local_60->flacFrameNumber = 0;
                local_60->pcmFrameNumber = _hi;
              }
              else {
                _hi = 0;
                mVar11 = ma_dr_flac__read_utf8_coded_number(bs,(ma_uint64 *)&hi,&local_80);
                if (mVar11 != MA_SUCCESS) goto LAB_0017c9fd;
                local_60->flacFrameNumber = _hi;
                local_60->pcmFrameNumber = 0;
              }
              pmVar6 = local_50;
              pmVar20 = local_60;
              mVar9 = 0xc0;
              if (local_44 != 1) {
                if ((byte)local_44 < 6) {
                  iVar12 = 0x90;
                  uVar17 = local_44;
LAB_0017cae6:
                  mVar9 = (ma_uint16)(iVar12 << ((byte)uVar17 & 0x1f));
                }
                else {
                  if (local_44 == 7) {
                    mVar10 = ma_dr_flac__read_uint16(bs,0x10,local_50);
                    if (mVar10 == 0) {
                      return 0;
                    }
                    mVar9 = *pmVar6;
                    local_80 = ""[(byte)((byte)mVar9 ^ ""[(byte)((byte)(mVar9 >> 8) ^ local_80)])];
                    if (mVar9 == 0xffff) {
                      return 0;
                    }
                  }
                  else {
                    if (local_44 != 6) {
                      uVar17 = (uint)(byte)((byte)local_44 - 8);
                      iVar12 = 0x100;
                      goto LAB_0017cae6;
                    }
                    mVar10 = ma_dr_flac__read_uint16(bs,8,local_50);
                    if (mVar10 == 0) {
                      return 0;
                    }
                    uVar2 = *(undefined4 *)pmVar6;
                    mVar9 = (ma_uint16)uVar2;
                    local_80 = ""[(byte)(local_80 ^ (byte)uVar2)];
                  }
                  mVar9 = mVar9 + 1;
                }
              }
              pmVar5 = local_60;
              *local_50 = mVar9;
              if ((byte)local_40 < 0xc) {
                mVar14 = *(ma_uint32 *)(&DAT_00191cd0 + local_40 * 4);
LAB_0017cb04:
                pmVar20->sampleRate = mVar14;
              }
              else {
                if (local_40 == 0xe) {
                  uVar17 = bs->consumedBits;
                  if (uVar17 == 0x40) {
                    mVar10 = ma_dr_flac__reload_cache(bs);
                    if (mVar10 == 0) {
                      return 0;
                    }
                    uVar17 = bs->consumedBits;
                  }
                  uVar15 = 0x40 - (ulong)uVar17;
                  if (uVar15 < 0x10) {
                    uVar3 = bs->cache;
                    local_70 = uVar15;
                    mVar10 = ma_dr_flac__reload_cache(bs);
                    if (mVar10 == 0) {
                      return 0;
                    }
                    uVar13 = 0x10 - (int)local_70;
                    if (0x40 - (ulong)bs->consumedBits < (ulong)uVar13) {
                      return 0;
                    }
                    bVar19 = (byte)uVar13;
                    uVar4 = bs->cache;
                    uVar17 = (uint)((~(0xffffffffffffffffU >> (bVar19 & 0x3f)) & uVar4) >>
                                   (-bVar19 & 0x3f)) |
                             (int)((~(0xffffffffffffffffU >> ((byte)uVar15 & 0x3f)) & uVar3) >>
                                  ((byte)uVar17 & 0x3f)) << (bVar19 & 0x1f);
                    pmVar20->sampleRate = uVar17;
                    bs->consumedBits = bs->consumedBits + uVar13;
                    mVar18 = uVar4 << (bVar19 & 0x3f);
                  }
                  else {
                    mVar18 = bs->cache;
                    uVar16 = (ushort)(mVar18 >> 0x30);
                    uVar17 = (uint)uVar16;
                    pmVar20->sampleRate = (uint)uVar16;
                    bs->consumedBits = bs->consumedBits + 0x10;
                    mVar18 = mVar18 << 0x10;
                  }
                  bs->cache = mVar18;
                  local_80 = ""[(byte)(""[(byte)((byte)(uVar17 >> 8) ^ local_80)] ^ (byte)uVar17)];
                  mVar14 = uVar17 * 10;
                  goto LAB_0017cb04;
                }
                if ((int)local_40 == 0xd) {
                  uVar17 = bs->consumedBits;
                  if (uVar17 == 0x40) {
                    mVar10 = ma_dr_flac__reload_cache(bs);
                    if (mVar10 == 0) {
                      return 0;
                    }
                    uVar17 = bs->consumedBits;
                  }
                  uVar15 = 0x40 - (ulong)uVar17;
                  if (uVar15 < 0x10) {
                    uVar3 = bs->cache;
                    local_70 = uVar15;
                    mVar10 = ma_dr_flac__reload_cache(bs);
                    if (mVar10 == 0) {
                      return 0;
                    }
                    uVar13 = 0x10 - (int)local_70;
                    if (0x40 - (ulong)bs->consumedBits < (ulong)uVar13) {
                      return 0;
                    }
                    bVar19 = (byte)uVar13;
                    uVar4 = bs->cache;
                    uVar17 = (uint)((~(0xffffffffffffffffU >> (bVar19 & 0x3f)) & uVar4) >>
                                   (-bVar19 & 0x3f)) |
                             (int)((~(0xffffffffffffffffU >> ((byte)uVar15 & 0x3f)) & uVar3) >>
                                  ((byte)uVar17 & 0x3f)) << (bVar19 & 0x1f);
                    uVar16 = (ushort)uVar17;
                    pmVar20->sampleRate = uVar17;
                    bs->consumedBits = bs->consumedBits + uVar13;
                    mVar18 = uVar4 << (bVar19 & 0x3f);
                  }
                  else {
                    mVar18 = bs->cache;
                    uVar16 = (ushort)(mVar18 >> 0x30);
                    pmVar20->sampleRate = (uint)uVar16;
                    bs->consumedBits = bs->consumedBits + 0x10;
                    mVar18 = mVar18 << 0x10;
                  }
                  bs->cache = mVar18;
                  local_80 = ""[(byte)((byte)uVar16 ^ ""[(byte)((byte)(uVar16 >> 8) ^ local_80)])];
                }
                else {
                  if ((int)local_40 != 0xc) goto LAB_0017cb5c;
                  uVar17 = bs->consumedBits;
                  if (uVar17 == 0x40) {
                    mVar10 = ma_dr_flac__reload_cache(bs);
                    if (mVar10 == 0) {
                      return 0;
                    }
                    uVar17 = bs->consumedBits;
                  }
                  uVar15 = 0x40 - (ulong)uVar17;
                  if (uVar15 < 8) {
                    uVar3 = bs->cache;
                    local_70 = uVar15;
                    mVar10 = ma_dr_flac__reload_cache(bs);
                    if (mVar10 == 0) {
                      return 0;
                    }
                    uVar13 = 8 - (int)local_70;
                    if (0x40 - (ulong)bs->consumedBits < (ulong)uVar13) {
                      return 0;
                    }
                    bVar19 = (byte)uVar13;
                    uVar4 = bs->cache;
                    uVar17 = (uint)((~(0xffffffffffffffffU >> (bVar19 & 0x3f)) & uVar4) >>
                                   (-bVar19 & 0x3f)) |
                             (int)((~(0xffffffffffffffffU >> ((byte)uVar15 & 0x3f)) & uVar3) >>
                                  ((byte)uVar17 & 0x3f)) << (bVar19 & 0x1f);
                    pmVar5->sampleRate = uVar17;
                    bs->consumedBits = bs->consumedBits + uVar13;
                    mVar18 = uVar4 << (bVar19 & 0x3f);
                  }
                  else {
                    mVar18 = bs->cache;
                    uVar17 = (uint)(byte)(mVar18 >> 0x38);
                    pmVar5->sampleRate = uVar17;
                    bs->consumedBits = bs->consumedBits + 8;
                    mVar18 = mVar18 << 8;
                  }
                  bs->cache = mVar18;
                  local_80 = ""[(byte)(local_80 ^ (byte)uVar17)];
                  pmVar5->sampleRate = uVar17 * 1000;
                  pmVar20 = pmVar5;
                }
              }
              pmVar7 = local_38;
              pmVar20->channelAssignment = local_7e;
              mVar8 = (&DAT_0018fa08)[local_68];
              if (local_68 == 0) {
                mVar8 = (ma_uint8)local_78;
              }
              pmVar20->bitsPerSample = mVar8;
              if (mVar8 != (ma_uint8)local_78) {
                return 0;
              }
              mVar10 = ma_dr_flac__read_uint8(bs,8,local_38);
              if (mVar10 == 0) {
                return 0;
              }
              if (*pmVar7 == local_80) {
                return 1;
              }
            }
          }
        }
      }
    }
LAB_0017cb5c:
    uVar15 = (ulong)local_78;
    header = local_60;
  } while( true );
}

Assistant:

static ma_bool32 ma_dr_flac__read_next_flac_frame_header(ma_dr_flac_bs* bs, ma_uint8 streaminfoBitsPerSample, ma_dr_flac_frame_header* header)
{
    const ma_uint32 sampleRateTable[12]  = {0, 88200, 176400, 192000, 8000, 16000, 22050, 24000, 32000, 44100, 48000, 96000};
    const ma_uint8 bitsPerSampleTable[8] = {0, 8, 12, (ma_uint8)-1, 16, 20, 24, (ma_uint8)-1};
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(header != NULL);
    for (;;) {
        ma_uint8 crc8 = 0xCE;
        ma_uint8 reserved = 0;
        ma_uint8 blockingStrategy = 0;
        ma_uint8 blockSize = 0;
        ma_uint8 sampleRate = 0;
        ma_uint8 channelAssignment = 0;
        ma_uint8 bitsPerSample = 0;
        ma_bool32 isVariableBlockSize;
        if (!ma_dr_flac__find_and_seek_to_next_sync_code(bs)) {
            return MA_FALSE;
        }
        if (!ma_dr_flac__read_uint8(bs, 1, &reserved)) {
            return MA_FALSE;
        }
        if (reserved == 1) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, reserved, 1);
        if (!ma_dr_flac__read_uint8(bs, 1, &blockingStrategy)) {
            return MA_FALSE;
        }
        crc8 = ma_dr_flac_crc8(crc8, blockingStrategy, 1);
        if (!ma_dr_flac__read_uint8(bs, 4, &blockSize)) {
            return MA_FALSE;
        }
        if (blockSize == 0) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, blockSize, 4);
        if (!ma_dr_flac__read_uint8(bs, 4, &sampleRate)) {
            return MA_FALSE;
        }
        crc8 = ma_dr_flac_crc8(crc8, sampleRate, 4);
        if (!ma_dr_flac__read_uint8(bs, 4, &channelAssignment)) {
            return MA_FALSE;
        }
        if (channelAssignment > 10) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, channelAssignment, 4);
        if (!ma_dr_flac__read_uint8(bs, 3, &bitsPerSample)) {
            return MA_FALSE;
        }
        if (bitsPerSample == 3 || bitsPerSample == 7) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, bitsPerSample, 3);
        if (!ma_dr_flac__read_uint8(bs, 1, &reserved)) {
            return MA_FALSE;
        }
        if (reserved == 1) {
            continue;
        }
        crc8 = ma_dr_flac_crc8(crc8, reserved, 1);
        isVariableBlockSize = blockingStrategy == 1;
        if (isVariableBlockSize) {
            ma_uint64 pcmFrameNumber;
            ma_result result = ma_dr_flac__read_utf8_coded_number(bs, &pcmFrameNumber, &crc8);
            if (result != MA_SUCCESS) {
                if (result == MA_AT_END) {
                    return MA_FALSE;
                } else {
                    continue;
                }
            }
            header->flacFrameNumber  = 0;
            header->pcmFrameNumber = pcmFrameNumber;
        } else {
            ma_uint64 flacFrameNumber = 0;
            ma_result result = ma_dr_flac__read_utf8_coded_number(bs, &flacFrameNumber, &crc8);
            if (result != MA_SUCCESS) {
                if (result == MA_AT_END) {
                    return MA_FALSE;
                } else {
                    continue;
                }
            }
            header->flacFrameNumber  = (ma_uint32)flacFrameNumber;
            header->pcmFrameNumber = 0;
        }
        MA_DR_FLAC_ASSERT(blockSize > 0);
        if (blockSize == 1) {
            header->blockSizeInPCMFrames = 192;
        } else if (blockSize <= 5) {
            MA_DR_FLAC_ASSERT(blockSize >= 2);
            header->blockSizeInPCMFrames = 576 * (1 << (blockSize - 2));
        } else if (blockSize == 6) {
            if (!ma_dr_flac__read_uint16(bs, 8, &header->blockSizeInPCMFrames)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->blockSizeInPCMFrames, 8);
            header->blockSizeInPCMFrames += 1;
        } else if (blockSize == 7) {
            if (!ma_dr_flac__read_uint16(bs, 16, &header->blockSizeInPCMFrames)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->blockSizeInPCMFrames, 16);
            if (header->blockSizeInPCMFrames == 0xFFFF) {
                return MA_FALSE;
            }
            header->blockSizeInPCMFrames += 1;
        } else {
            MA_DR_FLAC_ASSERT(blockSize >= 8);
            header->blockSizeInPCMFrames = 256 * (1 << (blockSize - 8));
        }
        if (sampleRate <= 11) {
            header->sampleRate = sampleRateTable[sampleRate];
        } else if (sampleRate == 12) {
            if (!ma_dr_flac__read_uint32(bs, 8, &header->sampleRate)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->sampleRate, 8);
            header->sampleRate *= 1000;
        } else if (sampleRate == 13) {
            if (!ma_dr_flac__read_uint32(bs, 16, &header->sampleRate)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->sampleRate, 16);
        } else if (sampleRate == 14) {
            if (!ma_dr_flac__read_uint32(bs, 16, &header->sampleRate)) {
                return MA_FALSE;
            }
            crc8 = ma_dr_flac_crc8(crc8, header->sampleRate, 16);
            header->sampleRate *= 10;
        } else {
            continue;
        }
        header->channelAssignment = channelAssignment;
        header->bitsPerSample = bitsPerSampleTable[bitsPerSample];
        if (header->bitsPerSample == 0) {
            header->bitsPerSample = streaminfoBitsPerSample;
        }
        if (header->bitsPerSample != streaminfoBitsPerSample) {
            return MA_FALSE;
        }
        if (!ma_dr_flac__read_uint8(bs, 8, &header->crc8)) {
            return MA_FALSE;
        }
#ifndef MA_DR_FLAC_NO_CRC
        if (header->crc8 != crc8) {
            continue;
        }
#endif
        return MA_TRUE;
    }
}